

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::init
          (DrawCallBatchingTest *this,EVP_PKEY_CTX *ctx)

{
  DrawCallBatchingTest *extraout_RAX;
  DrawCallBatchingTest *this_local;
  
  createShader(this);
  createAttributeDatas(this);
  createArrayBuffers(this);
  if ((((this->m_spec).useDrawElements & 1U) != 0) &&
     (createIndexData(this), ((this->m_spec).useIndexBuffer & 1U) != 0)) {
    createIndexBuffer(this);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void DrawCallBatchingTest::init (void)
{
	createShader();
	createAttributeDatas();
	createArrayBuffers();

	if (m_spec.useDrawElements)
	{
		createIndexData();

		if (m_spec.useIndexBuffer)
			createIndexBuffer();
	}
}